

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nni_msgq_close(nni_msgq *mq)

{
  uint uVar1;
  nni_msg *m;
  bool bVar2;
  nni_msg *msg;
  nni_aio *aio;
  nni_msgq *mq_local;
  
  nni_mtx_lock(&mq->mq_lock);
  mq->mq_closed = true;
  while (mq->mq_len != 0) {
    uVar1 = mq->mq_get;
    mq->mq_get = uVar1 + 1;
    m = mq->mq_msgs[uVar1];
    if (mq->mq_alloc <= mq->mq_get) {
      mq->mq_get = 0;
    }
    mq->mq_len = mq->mq_len - 1;
    nni_msg_free(m);
  }
  while( true ) {
    msg = (nni_msg *)nni_list_first(&mq->mq_aio_getq);
    bVar2 = true;
    if (msg == (nni_msg *)0x0) {
      msg = (nni_msg *)nni_list_first(&mq->mq_aio_putq);
      bVar2 = msg != (nni_msg *)0x0;
    }
    if (!bVar2) break;
    nni_aio_list_remove((nni_aio *)msg);
    nni_aio_finish_error((nni_aio *)msg,NNG_ECLOSED);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return;
}

Assistant:

void
nni_msgq_close(nni_msgq *mq)
{
	nni_aio *aio;

	nni_mtx_lock(&mq->mq_lock);
	mq->mq_closed = true;
	// Free the messages orphaned in the queue.
	while (mq->mq_len > 0) {
		nni_msg *msg = mq->mq_msgs[mq->mq_get++];
		if (mq->mq_get >= mq->mq_alloc) {
			mq->mq_get = 0;
		}
		mq->mq_len--;
		nni_msg_free(msg);
	}

	// Let all pending blockers know we are closing the queue.
	while (((aio = nni_list_first(&mq->mq_aio_getq)) != NULL) ||
	    ((aio = nni_list_first(&mq->mq_aio_putq)) != NULL)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, NNG_ECLOSED);
	}

	nni_mtx_unlock(&mq->mq_lock);
}